

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

void mxx::impl::
     samplesort<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0,true>
               (undefined8 begin,undefined8 end,undefined8 param_3)

{
  MPI_Datatype poVar1;
  MPI_Datatype mpi_dt;
  datatype dt;
  comm *comm_local;
  __normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
  end_local;
  __normal_iterator<std::tuple<int,_int,_int>_*,_std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>_>
  begin_local;
  
  dt._16_8_ = param_3;
  get_datatype<std::tuple<int,int,int>>();
  poVar1 = mxx::datatype::type((datatype *)&mpi_dt);
  samplesort<__gnu_cxx::__normal_iterator<std::tuple<int,int,int>*,std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0,true>
            (begin,end,poVar1,dt._16_8_);
  mxx::datatype::~datatype((datatype *)&mpi_dt);
  return;
}

Assistant:

void samplesort(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm)
{
    // get value type of underlying data
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;

    // get MPI type
    mxx::datatype dt = mxx::get_datatype<value_type>();
    MPI_Datatype mpi_dt = dt.type();

    // sort
    impl::samplesort<_Iterator, _Compare, _Stable>(begin, end, comp, mpi_dt, comm);
}